

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AstCompiler.cpp
# Opt level: O2

void __thiscall
compiler::CompilerAstWalker::onEnterBlockStatementAstNode
          (CompilerAstWalker *this,BlockStatementAstNode *param_1)

{
  EmissionContext::PushScope
            ((this->ec).super___shared_ptr<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr);
  return;
}

Assistant:

void onEnterBlockStatementAstNode(BlockStatementAstNode*  /*node*/) noexcept override {
    this->ec->PushScope();
  }